

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int sam_hdr_write(htsFile *fp,bam_hdr_t *h)

{
  cram_fd *fd_00;
  int iVar1;
  SAM_hdr *hdr;
  char *pcVar2;
  size_t sVar3;
  int local_34;
  int i;
  char *p;
  cram_fd *fd;
  bam_hdr_t *h_local;
  htsFile *fp_local;
  
  switch((fp->format).format) {
  case binary_format:
    (fp->format).category = sequence_data;
    (fp->format).format = bam;
  case bam:
    bam_hdr_write((fp->fp).bgzf,h);
    break;
  case text_format:
    (fp->format).category = sequence_data;
    (fp->format).format = sam;
  case sam:
    hputs(h->text,(fp->fp).hfile);
    pcVar2 = strstr(h->text,"@SQ\t");
    if (pcVar2 == (char *)0x0) {
      for (local_34 = 0; local_34 < h->n_targets; local_34 = local_34 + 1) {
        (fp->line).l = 0;
        kputsn("@SQ\tSN:",7,&fp->line);
        kputs(h->target_name[local_34],&fp->line);
        kputsn("\tLN:",4,&fp->line);
        kputw(h->target_len[local_34],&fp->line);
        kputc(10,&fp->line);
        sVar3 = hwrite((fp->fp).hfile,(fp->line).s,(fp->line).l);
        if (sVar3 != (fp->line).l) {
          return -1;
        }
      }
    }
    iVar1 = hflush((fp->fp).hfile);
    if (iVar1 != 0) {
      return -1;
    }
    break;
  default:
    abort();
  case cram:
    fd_00 = (fp->fp).cram;
    hdr = bam_header_to_cram(h);
    iVar1 = cram_set_header(fd_00,hdr);
    if (iVar1 < 0) {
      return -1;
    }
    if (fp->fn_aux != (char *)0x0) {
      cram_load_reference(fd_00,fp->fn_aux);
    }
    iVar1 = cram_write_SAM_hdr(fd_00,fd_00->header);
    if (iVar1 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int sam_hdr_write(htsFile *fp, const bam_hdr_t *h)
{
    switch (fp->format.format) {
    case binary_format:
        fp->format.category = sequence_data;
        fp->format.format = bam;
        /* fall-through */
    case bam:
        bam_hdr_write(fp->fp.bgzf, h);
        break;

    case cram: {
        cram_fd *fd = fp->fp.cram;
        if (cram_set_header(fd, bam_header_to_cram((bam_hdr_t *)h)) < 0) return -1;
        if (fp->fn_aux)
            cram_load_reference(fd, fp->fn_aux);
        if (cram_write_SAM_hdr(fd, fd->header) < 0) return -1;
        }
        break;

    case text_format:
        fp->format.category = sequence_data;
        fp->format.format = sam;
        /* fall-through */
    case sam: {
        char *p;
        hputs(h->text, fp->fp.hfile);
        p = strstr(h->text, "@SQ\t"); // FIXME: we need a loop to make sure "@SQ\t" does not match something unwanted!!!
        if (p == 0) {
            int i;
            for (i = 0; i < h->n_targets; ++i) {
                fp->line.l = 0;
                kputsn("@SQ\tSN:", 7, &fp->line); kputs(h->target_name[i], &fp->line);
                kputsn("\tLN:", 4, &fp->line); kputw(h->target_len[i], &fp->line); kputc('\n', &fp->line);
                if ( hwrite(fp->fp.hfile, fp->line.s, fp->line.l) != fp->line.l ) return -1;
            }
        }
        if ( hflush(fp->fp.hfile) != 0 ) return -1;
        }
        break;

    default:
        abort();
    }
    return 0;
}